

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT19937.h
# Opt level: O3

void __thiscall Nova::MT19937<float>::MT19937(MT19937<float> *this)

{
  int iVar1;
  int iVar2;
  
  this->_vptr_MT19937 = (_func_int **)&PTR__MT19937_0013c768;
  this->mt[0] = 0x1571;
  this->index = 1;
  iVar2 = 1;
  do {
    this->mt[iVar2] =
         (this->mt[(long)iVar2 + -1] >> 0x1e ^ this->mt[(long)iVar2 + -1]) * 0x6c078965 + iVar2;
    iVar1 = this->index;
    iVar2 = iVar1 + 1;
    this->index = iVar2;
  } while (iVar1 < 0x26f);
  return;
}

Assistant:

MT19937()
    {Set_Seed();}